

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall
calculator::FunctionDeclareException::~FunctionDeclareException(FunctionDeclareException *this)

{
  SyntaxError::~SyntaxError(&this->super_SyntaxError);
  operator_delete(this,0x28);
  return;
}

Assistant:

FunctionDeclareException(const std::string& function) {
        error_msg = "Error: function [" + function + "] unexpected ( ";
    }